

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

void ui_visuals_module_cleanup(void)

{
  visuals_flicker_free(visuals_flicker_table);
  visuals_cycler_free(visuals_cycler_table);
  if (visuals_color_cycles_by_race != (anon_struct_24_3_6ed953bc *)0x0) {
    if (visuals_color_cycles_by_race->race != (visuals_color_cycle **)0x0) {
      mem_free(visuals_color_cycles_by_race->race);
      visuals_color_cycles_by_race->race = (visuals_color_cycle **)0x0;
    }
    mem_free(visuals_color_cycles_by_race);
    visuals_color_cycles_by_race = (anon_struct_24_3_6ed953bc *)0x0;
  }
  return;
}

Assistant:

static void ui_visuals_module_cleanup(void)
{
	visuals_flicker_free(visuals_flicker_table);
	visuals_cycler_free(visuals_cycler_table);

	if (visuals_color_cycles_by_race != NULL) {
		if (visuals_color_cycles_by_race->race != NULL) {
			mem_free(visuals_color_cycles_by_race->race);
			visuals_color_cycles_by_race->race = NULL;
		}

		mem_free(visuals_color_cycles_by_race);
		visuals_color_cycles_by_race = NULL;
	}
}